

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::piece_picker::is_piece_free
          (piece_picker *this,piece_index_t piece,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bitmask)

{
  bool bVar1;
  value_type *pvVar2;
  undefined1 local_2d;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *bitmask_local;
  piece_picker *this_local;
  piece_index_t piece_local;
  
  bVar1 = typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          ::operator[](bitmask,(strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
                               piece.m_val);
  local_2d = 0;
  if (bVar1) {
    pvVar2 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
             ::operator[](&this->m_piece_map,
                          (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)piece.m_val);
    bVar1 = piece_pos::have(pvVar2);
    local_2d = 0;
    if (!bVar1) {
      pvVar2 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
               ::operator[](&this->m_piece_map,
                            (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)piece.m_val
                           );
      bVar1 = piece_pos::filtered(pvVar2);
      local_2d = bVar1 ^ 0xff;
    }
  }
  return (bool)(local_2d & 1);
}

Assistant:

bool piece_picker::is_piece_free(piece_index_t const piece
		, typed_bitfield<piece_index_t> const& bitmask) const
	{
		return bitmask[piece]
			&& !m_piece_map[piece].have()
			&& !m_piece_map[piece].filtered();
	}